

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O0

unzFile unzOpenInternal(void *path,zlib_filefunc64_32_def *pzlib_filefunc64_32_def,
                       int is64bitOpenFunction)

{
  int iVar1;
  long lVar2;
  ZPOS64_T extraout_RDX;
  ZPOS64_T extraout_RDX_00;
  ZPOS64_T ZVar3;
  ZPOS64_T local_1c0;
  ZPOS64_T uL64;
  uLong uS;
  voidpf pvStack_1a8;
  int err;
  ZPOS64_T number_entry_CD;
  uLong number_disk_with_CD;
  uLong number_disk;
  uLong uL;
  ZPOS64_T central_pos;
  unz64_s *s;
  unz64_s us;
  int is64bitOpenFunction_local;
  zlib_filefunc64_32_def *pzlib_filefunc64_32_def_local;
  void *path_local;
  
  uS._4_4_ = 0;
  us.z_filefunc.ztell32_file = (tell_file_func)0x0;
  us.z_filefunc.zopen32_file = (open_file_func)0x0;
  us.isZip64 = is64bitOpenFunction;
  if (pzlib_filefunc64_32_def == (zlib_filefunc64_32_def *)0x0) {
    fill_fopen64_filefunc((zlib_filefunc64_def *)&s);
  }
  else {
    memcpy(&s,pzlib_filefunc64_32_def,0x58);
  }
  us.z_filefunc.zseek32_file._0_4_ = us.isZip64;
  us._88_8_ = call_zopen64((zlib_filefunc64_32_def *)&s,path,5);
  if ((voidpf)us._88_8_ == (voidpf)0x0) {
    path_local = (void *)0x0;
  }
  else {
    uL = unz64local_SearchCentralDir64((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_);
    if (uL == 0) {
      uL = unz64local_SearchCentralDir((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_);
      if (uL == 0) {
        uS._4_4_ = -1;
      }
      us.pfile_in_zip_read._4_4_ = 0;
      lVar2 = call_zseek64((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,uL,0);
      if (lVar2 != 0) {
        uS._4_4_ = -1;
      }
      iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&number_disk);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,
                                  &number_disk_with_CD);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&number_entry_CD);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&number_disk);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      us.filestream = (voidpf)number_disk;
      iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&number_disk);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      pvStack_1a8 = (voidpf)number_disk;
      if ((((voidpf)number_disk != us.filestream) || (number_entry_CD != 0)) ||
         (number_disk_with_CD != 0)) {
        uS._4_4_ = -0x67;
      }
      iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&number_disk);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      us.central_pos = number_disk;
      iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&number_disk);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      us.size_central_dir = number_disk;
      iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&us.gi.number_entry
                                 );
      ZVar3 = extraout_RDX_00;
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
    }
    else {
      us.pfile_in_zip_read._4_4_ = 1;
      lVar2 = call_zseek64((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,uL,0);
      if (lVar2 != 0) {
        uS._4_4_ = -1;
      }
      iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&number_disk);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      iVar1 = unz64local_getLong64((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&local_1c0);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&uL64);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      iVar1 = unz64local_getShort((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&uL64);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&number_disk_with_CD
                                );
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      iVar1 = unz64local_getLong((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&number_entry_CD);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      iVar1 = unz64local_getLong64
                        ((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,(ZPOS64_T *)&us.filestream);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      iVar1 = unz64local_getLong64
                        ((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,
                         (ZPOS64_T *)&stack0xfffffffffffffe58);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      if (((pvStack_1a8 != us.filestream) || (number_entry_CD != 0)) || (number_disk_with_CD != 0))
      {
        uS._4_4_ = -0x67;
      }
      iVar1 = unz64local_getLong64((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&us.central_pos);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      iVar1 = unz64local_getLong64
                        ((zlib_filefunc64_32_def *)&s,(voidpf)us._88_8_,&us.size_central_dir);
      if (iVar1 != 0) {
        uS._4_4_ = -1;
      }
      us.gi.number_entry = 0;
      ZVar3 = extraout_RDX;
    }
    if ((uL < us.size_central_dir + us.central_pos) && (uS._4_4_ == 0)) {
      uS._4_4_ = -0x67;
    }
    if (uS._4_4_ == 0) {
      us.gi.size_comment = uL - (us.size_central_dir + us.central_pos);
      us.current_file_ok = uL;
      us.cur_file_info_internal.offset_curfile = 0;
      us.pfile_in_zip_read._0_4_ = 0;
      central_pos = (ZPOS64_T)malloc(0x150);
      if ((void *)central_pos != (void *)0x0) {
        memcpy((void *)central_pos,&s,0x150);
        unzGoToFirstFile((unzFile)central_pos);
      }
      path_local = (void *)central_pos;
    }
    else {
      (*us.z_filefunc.zfile_func64.zseek64_file)
                (us.z_filefunc.zfile_func64.zerror_file,(voidpf)us._88_8_,ZVar3,
                 (int)(us.size_central_dir + us.central_pos));
      path_local = (void *)0x0;
    }
  }
  return path_local;
}

Assistant:

local unzFile unzOpenInternal(const void* path,
    zlib_filefunc64_32_def* pzlib_filefunc64_32_def,
    int is64bitOpenFunction)
{
    unz64_s us;
    unz64_s* s;
    ZPOS64_T central_pos;
    uLong   uL;

    uLong number_disk;          /* number of the current dist, used for
                                   spaning ZIP, unsupported, always 0*/
    uLong number_disk_with_CD;  /* number the the disk with central dir, used
                                   for spaning ZIP, unsupported, always 0*/
    ZPOS64_T number_entry_CD;      /* total number of entries in
                                   the central dir
                                   (same than number_entry on nospan) */

    int err = UNZ_OK;

    if (unz_copyright[0] != ' ')
        return NULL;

    us.z_filefunc.zseek32_file = NULL;
    us.z_filefunc.ztell32_file = NULL;
    if (pzlib_filefunc64_32_def == NULL)
        fill_fopen64_filefunc(&us.z_filefunc.zfile_func64);
    else
        us.z_filefunc = *pzlib_filefunc64_32_def;
    us.is64bitOpenFunction = is64bitOpenFunction;



    us.filestream = ZOPEN64(us.z_filefunc,
        path,
        ZLIB_FILEFUNC_MODE_READ |
        ZLIB_FILEFUNC_MODE_EXISTING);
    if (us.filestream == NULL)
        return NULL;

    central_pos = unz64local_SearchCentralDir64(&us.z_filefunc, us.filestream);
    if (central_pos)
    {
        uLong uS;
        ZPOS64_T uL64;

        us.isZip64 = 1;

        if (ZSEEK64(us.z_filefunc, us.filestream,
            central_pos, ZLIB_FILEFUNC_SEEK_SET) != 0)
            err = UNZ_ERRNO;

        /* the signature, already checked */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;

        /* size of zip64 end of central directory record */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &uL64) != UNZ_OK)
            err = UNZ_ERRNO;

        /* version made by */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uS) != UNZ_OK)
            err = UNZ_ERRNO;

        /* version needed to extract */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uS) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of this disk */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &number_disk) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of the disk with the start of the central directory */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &number_disk_with_CD) != UNZ_OK)
            err = UNZ_ERRNO;

        /* total number of entries in the central directory on this disk */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &us.gi.number_entry) != UNZ_OK)
            err = UNZ_ERRNO;

        /* total number of entries in the central directory */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &number_entry_CD) != UNZ_OK)
            err = UNZ_ERRNO;

        if ((number_entry_CD != us.gi.number_entry) ||
            (number_disk_with_CD != 0) ||
            (number_disk != 0))
            err = UNZ_BADZIPFILE;

        /* size of the central directory */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &us.size_central_dir) != UNZ_OK)
            err = UNZ_ERRNO;

        /* offset of start of central directory with respect to the
          starting disk number */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &us.offset_central_dir) != UNZ_OK)
            err = UNZ_ERRNO;

        us.gi.size_comment = 0;
    }
    else
    {
        central_pos = unz64local_SearchCentralDir(&us.z_filefunc, us.filestream);
        if (central_pos == 0)
            err = UNZ_ERRNO;

        us.isZip64 = 0;

        if (ZSEEK64(us.z_filefunc, us.filestream,
            central_pos, ZLIB_FILEFUNC_SEEK_SET) != 0)
            err = UNZ_ERRNO;

        /* the signature, already checked */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of this disk */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &number_disk) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of the disk with the start of the central directory */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &number_disk_with_CD) != UNZ_OK)
            err = UNZ_ERRNO;

        /* total number of entries in the central dir on this disk */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        us.gi.number_entry = uL;

        /* total number of entries in the central dir */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        number_entry_CD = uL;

        if ((number_entry_CD != us.gi.number_entry) ||
            (number_disk_with_CD != 0) ||
            (number_disk != 0))
            err = UNZ_BADZIPFILE;

        /* size of the central directory */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        us.size_central_dir = uL;

        /* offset of start of central directory with respect to the
            starting disk number */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        us.offset_central_dir = uL;

        /* zipfile comment length */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &us.gi.size_comment) != UNZ_OK)
            err = UNZ_ERRNO;
    }

    if ((central_pos < us.offset_central_dir + us.size_central_dir) &&
        (err == UNZ_OK))
        err = UNZ_BADZIPFILE;

    if (err != UNZ_OK)
    {
        ZCLOSE64(us.z_filefunc, us.filestream);
        return NULL;
    }

    us.byte_before_the_zipfile = central_pos -
        (us.offset_central_dir + us.size_central_dir);
    us.central_pos = central_pos;
    us.pfile_in_zip_read = NULL;
    us.encrypted = 0;


    s = (unz64_s*)ALLOC(sizeof(unz64_s));
    if (s != NULL)
    {
        *s = us;
        unzGoToFirstFile((unzFile)s);
    }
    return (unzFile)s;
}